

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall DIntermissionController::Ticker(DIntermissionController *this)

{
  DIntermissionScreen *pDVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  
  bVar2 = this->mAdvance;
  if ((bool)bVar2 == true) {
    this->mSentAdvance = false;
  }
  pDVar1 = (this->mScreen).field_0.p;
  if (pDVar1 != (DIntermissionScreen *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      iVar4 = (*(pDVar1->super_DObject)._vptr_DObject[9])();
      bVar2 = iVar4 == -1 | this->mAdvance;
      this->mAdvance = (bool)bVar2;
    }
    else {
      (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
    }
  }
  if (bVar2 != 0) {
    this->mAdvance = false;
    bVar3 = NextPage(this);
    if (bVar3) {
      return;
    }
    if (this->mGameState == '\x01') {
      gameaction = ga_worlddone;
    }
    else {
      if (this->mGameState != '\x02') {
        return;
      }
      if ((level.cdtrack == 0) || (bVar3 = S_ChangeCDMusic(level.cdtrack,level.cdid,true), !bVar3))
      {
        S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
      }
      gamestate = GS_LEVEL;
      wipegamestate = GS_LEVEL;
      P_ResumeConversation();
      viewactive = true;
    }
    (*(this->super_DObject)._vptr_DObject[4])(this);
    return;
  }
  return;
}

Assistant:

void DIntermissionController::Ticker ()
{
	if (mAdvance)
	{
		mSentAdvance = false;
	}
	if (mScreen != NULL)
	{
		mAdvance |= (mScreen->Ticker() == -1);
	}
	if (mAdvance)
	{
		mAdvance = false;
		if (!NextPage())
		{
			switch (mGameState)
			{
			case FSTATE_InLevel:
				if (level.cdtrack == 0 || !S_ChangeCDMusic (level.cdtrack, level.cdid))
					S_ChangeMusic (level.Music, level.musicorder);
				gamestate = GS_LEVEL;
				wipegamestate = GS_LEVEL;
				P_ResumeConversation ();
				viewactive = true;
				Destroy();
				break;

			case FSTATE_ChangingLevel:
				gameaction = ga_worlddone;
				Destroy();
				break;

			default:
				break;
			}
		}
	}
}